

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_and_recv(connectdata *conn,void **msg)

{
  CURLcode CVar1;
  size_t local_40;
  size_t local_38;
  size_t nread;
  anon_union_240_10_26c073a1_for_proto *paStack_28;
  CURLcode result;
  smb_conn *smbc;
  void **msg_local;
  connectdata *conn_local;
  
  paStack_28 = &conn->proto;
  smbc = (smb_conn *)msg;
  msg_local = &conn->data;
  if (((conn->proto).ftpc.pp.response.tv_sec == 0) && ((conn->proto).ftpc.pp.sendsize != 0)) {
    if ((conn->data->set).upload_buffer_size < (conn->proto).ftpc.pp.sendsize) {
      local_40 = (conn->data->set).upload_buffer_size;
    }
    else {
      local_40 = (conn->proto).smbc.upload_size;
    }
    local_38 = local_40;
    (conn->data->req).upload_fromhere = (conn->data->state).ulbuf;
    nread._4_4_ = Curl_fillreadbuffer(conn,local_40,&local_38);
    if ((nread._4_4_ != CURLE_OK) && (nread._4_4_ != CURLE_AGAIN)) {
      return nread._4_4_;
    }
    if (local_38 == 0) {
      return CURLE_OK;
    }
    (paStack_28->ftpc).pp.sendsize = (paStack_28->ftpc).pp.sendsize - local_38;
    (paStack_28->smbc).send_size = local_38;
    *(undefined8 *)&(paStack_28->ftpc).pp.response.tv_usec = 0;
  }
  if ((paStack_28->ftpc).pp.response.tv_sec != 0) {
    CVar1 = smb_flush((connectdata *)msg_local);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    nread._4_4_ = CURLE_OK;
  }
  if (((paStack_28->ftpc).pp.response.tv_sec == 0) && ((paStack_28->ftpc).pp.sendsize == 0)) {
    conn_local._4_4_ = smb_recv_message((connectdata *)msg_local,(void **)smbc);
  }
  else {
    conn_local._4_4_ = CURLE_AGAIN;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_send_and_recv(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > conn->data->set.upload_buffer_size ?
      conn->data->set.upload_buffer_size :
      smbc->upload_size;
    conn->data->req.upload_fromhere = conn->data->state.ulbuf;
    result = Curl_fillreadbuffer(conn, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(conn);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(conn, msg);
}